

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_optimization.cc
# Opt level: O3

void __thiscall
QPDF::optimize(QPDF *this,ObjTable *obj,function<int_(QPDFObjectHandle_&)> *skip_stream_parameters)

{
  _Any_data _Stack_38;
  _Manager_type local_28;
  
  std::function<int_(QPDFObjectHandle_&)>::function
            ((function<int_(QPDFObjectHandle_&)> *)&_Stack_38,skip_stream_parameters);
  optimize_internal<QPDFWriter::ObjTable>
            (this,obj,true,(function<int_(QPDFObjectHandle_&)> *)&_Stack_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&_Stack_38,&_Stack_38,__destroy_functor);
  }
  return;
}

Assistant:

void
QPDF::optimize(
    QPDFWriter::ObjTable const& obj, std::function<int(QPDFObjectHandle&)> skip_stream_parameters)
{
    optimize_internal(obj, true, skip_stream_parameters);
}